

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-unix.c++
# Opt level: O2

void kj::UnixEventPort::ignoreSigpipe(void)

{
  int iVar1;
  __sighandler_t p_Var2;
  int *piVar3;
  Fault FStack_18;
  
  if ((ignoreSigpipe()::once == '\0') &&
     (iVar1 = __cxa_guard_acquire(&ignoreSigpipe()::once), iVar1 != 0)) {
    do {
      p_Var2 = signal(0xd,(__sighandler_t)0x1);
      if (p_Var2 != (__sighandler_t)0xffffffffffffffff) {
        __cxa_guard_release(&ignoreSigpipe()::once);
        return;
      }
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    kj::_::Debug::Fault::Fault
              (&FStack_18,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-unix.c++"
               ,0xe6,*piVar3,"signal(SIGPIPE, SIG_IGN)","");
    kj::_::Debug::Fault::fatal(&FStack_18);
  }
  return;
}

Assistant:

void UnixEventPort::ignoreSigpipe() {
  // We disable SIGPIPE because users of UnixEventPort almost certainly don't want it.
  //
  // We've observed that when starting many threads at the same time, this can cause some
  // contention on the kernel's signal handler table lock, so we try to run it only once.
  static bool once KJ_UNUSED = []() {
    while (signal(SIGPIPE, SIG_IGN) == SIG_ERR) {
      int error = errno;
      if (error != EINTR) {
        KJ_FAIL_SYSCALL("signal(SIGPIPE, SIG_IGN)", error);
      }
    }
    return true;
  }();
}